

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atom.cpp
# Opt level: O2

void __thiscall indigox::Atom::Clear(Atom *this)

{
  value_type_conflict1 local_c;
  
  std::__weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->mol_).super___weak_ptr<indigox::Molecule,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->element_).super___shared_ptr<indigox::Element,_(__gnu_cxx::_Lock_policy)2>);
  std::vector<std::weak_ptr<indigox::Bond>,_std::allocator<std::weak_ptr<indigox::Bond>_>_>::clear
            (&this->bonds_);
  local_c = 0.0;
  std::array<float,_3UL>::fill(&this->pos_,&local_c);
  return;
}

Assistant:

void Atom::Clear() {
    mol_.reset();
    element_.reset();
    bonds_.clear();
    pos_.fill(0.0);
  }